

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm_fwd.hpp
# Opt level: O3

int __thiscall mxx::comm::copy(comm *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  MPI_Comm *ppoVar1;
  
  this->_vptr_comm = (_func_int **)&PTR__comm_0013d640;
  ppoVar1 = &this->mpi_comm;
  this->mpi_comm = (MPI_Comm)&ompi_mpi_comm_world;
  MPI_Comm_size(&ompi_mpi_comm_world,&this->m_size);
  MPI_Comm_rank(this->mpi_comm,&this->m_rank);
  this->do_free = false;
  MPI_Comm_dup(*(undefined8 *)(dst + 8),ppoVar1);
  MPI_Comm_size(*ppoVar1,&this->m_size);
  MPI_Comm_rank(*ppoVar1,&this->m_rank);
  this->do_free = true;
  return (int)this;
}

Assistant:

comm copy() const {
        comm o;
        MPI_Comm_dup(mpi_comm, &o.mpi_comm);
        o.init_ranksize();
        o.do_free = true;
        return o;
    }